

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_input.c
# Opt level: O2

mpt_input * mpt_stream_input(mpt_socket *from,int mode,int code,size_t idlen)

{
  int iVar1;
  mpt_input *pmVar2;
  int *piVar3;
  mpt_stream tmp;
  mpt_stream local_c0;
  
  memset(&local_c0,0,0x98);
  local_c0._rd._state.data.msg = -1;
  if ((idlen < 0x100) && (code != 0)) {
    if ((mode & 1U) != 0) {
      if ((mode & 2U) == 0) goto LAB_00106f61;
      local_c0._wd._enc = (mpt_data_encoder_t)mpt_message_encoder(code);
      if (local_c0._wd._enc == (mpt_data_encoder_t)0x0) {
        return (mpt_input *)0x0;
      }
    }
    local_c0._rd._dec = (mpt_data_decoder_t)mpt_message_decoder(code);
    if (local_c0._rd._dec == (mpt_data_decoder_t)0x0) {
      return (mpt_input *)0x0;
    }
    iVar1 = mpt_stream_dopen(&local_c0,from,mode);
    if (-1 < iVar1) {
      pmVar2 = (mpt_input *)malloc(idlen + 0xb8);
      if (pmVar2 == (mpt_input *)0x0) {
        mpt_stream_close(&local_c0);
        return (mpt_input *)0x0;
      }
      pmVar2->_vptr = &mpt_stream_input::streamInput;
      pmVar2[1]._vptr = (_mpt_vptr_input *)0x1;
      memcpy(pmVar2 + 2,&local_c0,0x98);
      pmVar2[0x15]._vptr = (_mpt_vptr_input *)&mpt_stream_input::streamContext;
      *(short *)&pmVar2[0x16]._vptr = (short)idlen;
      *(undefined2 *)((long)&pmVar2[0x16]._vptr + 2) = 0;
      return pmVar2;
    }
  }
LAB_00106f61:
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return (mpt_input *)0x0;
}

Assistant:

extern MPT_INTERFACE(input) *mpt_stream_input(const MPT_STRUCT(socket) *from, int mode, int code, size_t idlen)
{
	static const MPT_INTERFACE_VPTR(input) streamInput = {
		{ { streamConv },
		  streamUnref,
		  streamRef,
		  streamClone
		},
		streamNext,
		streamDispatch
	};
	static const MPT_INTERFACE_VPTR(reply_context) streamContext = {
		streamReply,
		streamDefer
	};
	MPT_STRUCT(stream) tmp = MPT_STREAM_INIT;
	MPT_STRUCT(streamInput) *srm;
	
	/* id size limit exceeded */
	if (idlen > UINT8_MAX) {
		errno = EINVAL;
		return 0;
	}
	/* id requires message format on stream */
	if (!code) {
		errno = EINVAL;
		return 0;
	}
	/* bidirectional mode for reply */
	if (mode & MPT_STREAMFLAG(Write)) {
		if (!(mode & MPT_STREAMFLAG(RdWr))) {
			errno = EINVAL;
			return 0;
		}
		if (!(tmp._wd._enc = mpt_message_encoder(code))) {
			return 0;
		}
	}
	/* input codec for message */
	if (!(tmp._rd._dec = mpt_message_decoder(code))) {
		return 0;
	}
	/* set temporary data, no resource leakage on error */
	if (mpt_stream_dopen(&tmp, from, mode) < 0) {
		errno = EINVAL;
		return 0;
	}
	if (!(srm = malloc(sizeof(*srm) + idlen))) {
		mpt_stream_close(&tmp);
		return 0;
	}
	srm->_in._vptr = &streamInput;
	srm->ref._val = 1;
	
	srm->data = tmp;
	
	srm->_rc._vptr = &streamContext;
	srm->rd._max = idlen;
	srm->rd.len = 0;
	
	return &srm->_in;
}